

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O3

int jas_image_addcmpt(jas_image_t *image,int cmptno,jas_image_cmptparm_t *cmptparm)

{
  int iVar1;
  uint uVar2;
  jas_image_cmpt_t *pjVar3;
  
  uVar2 = image->numcmpts_;
  if (cmptno < 0) {
    cmptno = uVar2;
    if ((int)uVar2 < 0) goto LAB_001108ff;
  }
  else if (uVar2 < (uint)cmptno) {
LAB_001108ff:
    __assert_fail("cmptno >= 0 && (unsigned)cmptno <= image->numcmpts_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_image.c"
                  ,0x2fb,"int jas_image_addcmpt(jas_image_t *, int, const jas_image_cmptparm_t *)");
  }
  if ((image->maxcmpts_ <= uVar2) &&
     (iVar1 = jas_image_growcmpts(image,image->maxcmpts_ + 0x80), iVar1 != 0)) {
    return -1;
  }
  pjVar3 = jas_image_cmpt_create
                     (cmptparm->tlx,cmptparm->tly,cmptparm->hstep,cmptparm->vstep,cmptparm->width,
                      cmptparm->height,(long)cmptparm->prec,cmptparm->sgnd != 0,true);
  if (pjVar3 == (jas_image_cmpt_t *)0x0) {
    iVar1 = -1;
  }
  else {
    uVar2 = image->numcmpts_;
    if ((uint)cmptno <= uVar2 && uVar2 - cmptno != 0) {
      memmove(image->cmpts_ + (ulong)(uint)cmptno + 1,image->cmpts_ + (uint)cmptno,
              (ulong)(uVar2 - cmptno) << 3);
      uVar2 = image->numcmpts_;
    }
    image->cmpts_[(uint)cmptno] = pjVar3;
    image->numcmpts_ = uVar2 + 1;
    jas_image_setbbox(image);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int jas_image_addcmpt(jas_image_t *image, int cmptno,
  const jas_image_cmptparm_t *cmptparm)
{
	jas_image_cmpt_t *newcmpt;
	if (cmptno < 0) {
		cmptno = image->numcmpts_;
	}
	assert(cmptno >= 0 && (unsigned)cmptno <= image->numcmpts_);
	if (image->numcmpts_ >= image->maxcmpts_) {
		if (jas_image_growcmpts(image, image->maxcmpts_ + 128)) {
			return -1;
		}
	}
	if (!(newcmpt = jas_image_cmpt_create(cmptparm->tlx,
	  cmptparm->tly, cmptparm->hstep, cmptparm->vstep,
	  cmptparm->width, cmptparm->height, cmptparm->prec,
	  cmptparm->sgnd, true))) {
		return -1;
	}
	if ((unsigned)cmptno < image->numcmpts_) {
		memmove(&image->cmpts_[cmptno + 1], &image->cmpts_[cmptno],
		  (image->numcmpts_ - (unsigned)cmptno) * sizeof(jas_image_cmpt_t *));
	}
	image->cmpts_[cmptno] = newcmpt;
	++image->numcmpts_;

	jas_image_setbbox(image);

	return 0;
}